

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signet.cpp
# Opt level: O0

uint256 * ComputeModifiedMerkleRoot(CMutableTransaction *cb,CBlock *block)

{
  long lVar1;
  uint256 *puVar2;
  reference pvVar3;
  bool *pbVar4;
  uint256 *in_RDI;
  long in_FS_OFFSET;
  size_t s;
  vector<uint256,_std::allocator<uint256>_> leaves;
  CTransaction *in_stack_ffffffffffffff38;
  size_type in_stack_ffffffffffffff40;
  uint256 *in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  CMutableTransaction *in_stack_ffffffffffffff58;
  bool *pbVar5;
  bool *mutated;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff38);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *)in_stack_ffffffffffffff38);
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  CMutableTransaction::GetHash(in_stack_ffffffffffffff58);
  puVar2 = transaction_identifier::operator_cast_to_uint256_
                     ((transaction_identifier<false> *)in_stack_ffffffffffffff38);
  pvVar3 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                     ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff40);
  *(undefined8 *)(pvVar3->super_base_blob<256U>).m_data._M_elems =
       *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
  *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 8) =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
  *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x18) =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
  pbVar5 = (bool *)0x1;
  while( true ) {
    mutated = pbVar5;
    pbVar4 = (bool *)std::
                     vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                             *)in_stack_ffffffffffffff38);
    if (pbVar4 <= pbVar5) break;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff38);
    CTransaction::GetHash(in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff48 =
         transaction_identifier::operator_cast_to_uint256_
                   ((transaction_identifier<false> *)in_stack_ffffffffffffff38);
    pvVar3 = std::vector<uint256,_std::allocator<uint256>_>::operator[]
                       ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40);
    *(undefined8 *)(pvVar3->super_base_blob<256U>).m_data._M_elems =
         *(undefined8 *)(in_stack_ffffffffffffff48->super_base_blob<256U>).m_data._M_elems;
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 8) =
         *(undefined8 *)((in_stack_ffffffffffffff48->super_base_blob<256U>).m_data._M_elems + 8);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((in_stack_ffffffffffffff48->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((pvVar3->super_base_blob<256U>).m_data._M_elems + 0x18) =
         *(undefined8 *)((in_stack_ffffffffffffff48->super_base_blob<256U>).m_data._M_elems + 0x18);
    pbVar5 = mutated + 1;
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff38,
             (vector<uint256,_std::allocator<uint256>_> *)0x140845a);
  ComputeMerkleRoot(in_stack_ffffffffffffff88,mutated);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff48);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static uint256 ComputeModifiedMerkleRoot(const CMutableTransaction& cb, const CBlock& block)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    leaves[0] = cb.GetHash();
    for (size_t s = 1; s < block.vtx.size(); ++s) {
        leaves[s] = block.vtx[s]->GetHash();
    }
    return ComputeMerkleRoot(std::move(leaves));
}